

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O1

void __thiscall btHingeConstraint::buildJacobian(btHingeConstraint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  btRigidBody *pbVar5;
  btRigidBody *pbVar6;
  long lVar7;
  btJacobianEntry *this_00;
  float fVar8;
  btScalar angle;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btMatrix3x3 local_148;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  btMatrix3x3 local_c8;
  btVector3 jointAxis0;
  btVector3 hingeAxisWorld;
  btVector3 jointAxis1;
  
  if (this->m_useSolveConstraintObsolete == true) {
    (this->super_btTypedConstraint).m_appliedImpulse = 0.0;
    this->m_accMotorImpulse = 0.0;
    if (this->m_angularOnly == false) {
      pbVar5 = (this->super_btTypedConstraint).m_rbA;
      pbVar6 = (this->super_btTypedConstraint).m_rbB;
      fVar9 = (this->m_rbAFrame).m_origin.m_floats[1];
      fVar11 = (this->m_rbAFrame).m_origin.m_floats[0];
      fVar8 = (this->m_rbAFrame).m_origin.m_floats[2];
      uVar4 = *(undefined8 *)(pbVar5->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_e8._0_4_ =
           fVar8 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] +
           fVar11 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
           fVar9 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] +
           (float)uVar4;
      local_e8._4_4_ =
           fVar8 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] +
           fVar11 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
           fVar9 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] +
           (float)((ulong)uVar4 >> 0x20);
      fStack_e0 = fVar8 * 0.0 + fVar11 * 0.0 + fVar9 * 0.0 + 0.0;
      fStack_dc = fVar8 * 0.0 + fVar11 * 0.0 + fVar9 * 0.0 + 0.0;
      fVar15 = (this->m_rbBFrame).m_origin.m_floats[1];
      fVar10 = (this->m_rbBFrame).m_origin.m_floats[0];
      fVar16 = (this->m_rbBFrame).m_origin.m_floats[2];
      local_d8._0_4_ =
           fVar16 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] +
           fVar10 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] +
           fVar15 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1] +
           (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      local_d8._4_4_ =
           fVar8 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] +
           fVar11 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] +
           fVar9 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1] +
           (pbVar5->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      fStack_d0 = this->m_motorTargetVelocity * 0.0 +
                  (this->m_rbBFrame).m_origin.m_floats[2] * 0.0 +
                  (this->m_rbBFrame).m_origin.m_floats[3] * 0.0 + 0.0;
      fStack_cc = this->m_maxMotorImpulse * 0.0 +
                  (this->m_rbBFrame).m_origin.m_floats[3] * 0.0 + this->m_motorTargetVelocity * 0.0
                  + 0.0;
      uVar4 = *(undefined8 *)(pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_f8._0_4_ =
           fVar16 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] +
           fVar10 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
           fVar15 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] +
           (float)uVar4;
      local_f8._4_4_ =
           fVar16 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] +
           fVar10 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
           fVar15 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] +
           (float)((ulong)uVar4 >> 0x20);
      fStack_f0 = fVar16 * 0.0 + fVar10 * 0.0 + fVar15 * 0.0 + 0.0;
      fStack_ec = fVar16 * 0.0 + fVar10 * 0.0 + fVar15 * 0.0 + 0.0;
      fVar9 = (float)local_f8._0_4_ - (float)local_e8._0_4_;
      fVar11 = (float)local_f8._4_4_ - (float)local_e8._4_4_;
      local_108._4_4_ = local_d8._4_4_;
      local_108._0_4_ = local_d8._4_4_;
      fStack_100 = (float)local_d8._4_4_;
      fStack_fc = (float)local_d8._4_4_;
      fVar15 = (float)local_d8._0_4_ - (float)local_d8._4_4_;
      fVar8 = fVar15 * fVar15 + fVar9 * fVar9 + fVar11 * fVar11;
      if (fVar8 <= 1.1920929e-07) {
        local_148.m_el[0].m_floats = (btScalar  [4])ZEXT816(0x3f800000);
      }
      else {
        if (fVar8 < 0.0) {
          local_118._4_4_ = fVar11;
          local_118._0_4_ = fVar9;
          fStack_110 = fStack_f0 - fStack_e0;
          fStack_10c = fStack_ec - fStack_dc;
          fVar8 = sqrtf(fVar8);
          fVar9 = (float)local_118._0_4_;
          fVar11 = (float)local_118._4_4_;
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        fVar8 = 1.0 / fVar8;
        local_148.m_el[0].m_floats[1] = fVar11 * fVar8;
        local_148.m_el[0].m_floats[0] = fVar9 * fVar8;
        local_148.m_el[0].m_floats[2] = fVar15 * fVar8;
        local_148.m_el[0].m_floats[3] = 0.0;
      }
      if (ABS(local_148.m_el[0].m_floats[2]) <= 0.70710677) {
        fVar9 = local_148.m_el[0].m_floats[0] * local_148.m_el[0].m_floats[0] +
                local_148.m_el[0].m_floats[1] * local_148.m_el[0].m_floats[1];
        if (fVar9 < 0.0) {
          _local_118 = ZEXT416((uint)fVar9);
          fVar11 = sqrtf(fVar9);
          fVar9 = (float)local_118._0_4_;
        }
        else {
          fVar11 = SQRT(fVar9);
        }
        fVar11 = 1.0 / fVar11;
        local_148.m_el[1].m_floats[2] = 0.0;
        local_148.m_el[2].m_floats[2] = fVar9 * fVar11;
        local_148.m_el[1].m_floats[1] = local_148.m_el[0].m_floats[0] * fVar11;
        local_148.m_el[1].m_floats[0] = -local_148.m_el[0].m_floats[1] * fVar11;
        local_148.m_el[2].m_floats[1] =
             local_148.m_el[0].m_floats[2] * local_148.m_el[1].m_floats[0];
        local_148.m_el[2].m_floats[0] =
             -local_148.m_el[0].m_floats[2] * local_148.m_el[1].m_floats[1];
      }
      else {
        fVar9 = local_148.m_el[0].m_floats[1] * local_148.m_el[0].m_floats[1] +
                local_148.m_el[0].m_floats[2] * local_148.m_el[0].m_floats[2];
        if (fVar9 < 0.0) {
          _local_118 = ZEXT416((uint)fVar9);
          fVar11 = sqrtf(fVar9);
          fVar9 = (float)local_118._0_4_;
        }
        else {
          fVar11 = SQRT(fVar9);
        }
        fVar11 = 1.0 / fVar11;
        local_148.m_el[1].m_floats[0] = 0.0;
        local_148.m_el[1].m_floats[1] = -local_148.m_el[0].m_floats[2] * fVar11;
        local_148.m_el[1].m_floats[2] = local_148.m_el[0].m_floats[1] * fVar11;
        local_148.m_el[2].m_floats[1] =
             local_148.m_el[1].m_floats[2] * -local_148.m_el[0].m_floats[0];
        local_148.m_el[2].m_floats[0] = fVar11 * fVar9;
        local_148.m_el[2].m_floats[2] =
             local_148.m_el[1].m_floats[1] * local_148.m_el[0].m_floats[0];
      }
      this_00 = this->m_jac;
      lVar7 = 0;
      do {
        pbVar5 = (this->super_btTypedConstraint).m_rbA;
        local_c8.m_el[0].m_floats[0] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
        local_c8.m_el[0].m_floats[1] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
        local_c8.m_el[0].m_floats[2] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
        local_c8.m_el[0].m_floats[3] = 0.0;
        local_c8.m_el[1].m_floats[0] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
        local_c8.m_el[1].m_floats[1] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
        local_c8.m_el[1].m_floats[2] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
        local_c8.m_el[1].m_floats[3] = 0.0;
        local_c8.m_el[2].m_floats[0] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
        local_c8.m_el[2].m_floats[1] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
        local_c8.m_el[2].m_floats[2] =
             (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
        local_c8.m_el[2].m_floats[3] = 0.0;
        pbVar6 = (this->super_btTypedConstraint).m_rbB;
        jointAxis0.m_floats[1] =
             (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
        jointAxis0.m_floats[0] =
             (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
        jointAxis0.m_floats[2] =
             (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
        jointAxis0.m_floats[3] = 0.0;
        uVar4 = *(undefined8 *)(pbVar5->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
        jointAxis1.m_floats[1] = (float)local_e8._4_4_ - (float)((ulong)uVar4 >> 0x20);
        jointAxis1.m_floats[0] = (float)local_e8._0_4_ - (float)uVar4;
        jointAxis1.m_floats[2] =
             (float)local_108._0_4_ -
             (pbVar5->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
        jointAxis1.m_floats[3] = 0.0;
        uVar4 = *(undefined8 *)(pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
        hingeAxisWorld.m_floats[1] = (float)local_f8._4_4_ - (float)((ulong)uVar4 >> 0x20);
        hingeAxisWorld.m_floats[0] = (float)local_f8._0_4_ - (float)uVar4;
        hingeAxisWorld.m_floats[2] =
             (float)local_d8._0_4_ -
             (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
        hingeAxisWorld.m_floats[3] = 0.0;
        btJacobianEntry::btJacobianEntry
                  (this_00,&local_c8,(btMatrix3x3 *)&jointAxis0,&jointAxis1,&hingeAxisWorld,
                   (btVector3 *)((long)local_148.m_el[0].m_floats + lVar7),
                   &pbVar5->m_invInertiaLocal,pbVar5->m_inverseMass,&pbVar6->m_invInertiaLocal,
                   pbVar6->m_inverseMass);
        lVar7 = lVar7 + 0x10;
        this_00 = this_00 + 1;
      } while (lVar7 != 0x30);
    }
    fVar9 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar11 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar8 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    if (ABS(fVar8) <= 0.70710677) {
      fVar15 = fVar9 * fVar9 + fVar11 * fVar11;
      if (fVar15 < 0.0) {
        _local_d8 = ZEXT416((uint)fVar9);
        _local_e8 = ZEXT416((uint)fVar8);
        _local_f8 = ZEXT416((uint)fVar11);
        _local_108 = ZEXT416((uint)fVar15);
        fVar10 = sqrtf(fVar15);
        fVar11 = (float)local_f8._0_4_;
        fVar15 = (float)local_108._0_4_;
        fVar8 = (float)local_e8._0_4_;
        fVar9 = (float)local_d8._0_4_;
      }
      else {
        fVar10 = SQRT(fVar15);
      }
      fVar12 = 0.0;
      fVar10 = 1.0 / fVar10;
      fVar13 = -fVar11 * fVar10;
      fVar14 = fVar9 * fVar10;
      fVar16 = -fVar8 * fVar14;
      fVar8 = fVar8 * fVar13;
      fVar9 = fVar15 * fVar10;
    }
    else {
      fVar16 = fVar11 * fVar11 + fVar8 * fVar8;
      if (fVar16 < 0.0) {
        _local_d8 = ZEXT416((uint)fVar9);
        _local_108 = ZEXT416((uint)fVar16);
        _local_e8 = ZEXT416((uint)fVar8);
        _local_f8 = ZEXT416((uint)fVar11);
        fVar15 = sqrtf(fVar16);
        fVar11 = (float)local_f8._0_4_;
        fVar8 = (float)local_e8._0_4_;
        fVar9 = (float)local_d8._0_4_;
        fVar16 = (float)local_108._0_4_;
      }
      else {
        fVar15 = SQRT(fVar16);
      }
      fVar13 = 0.0;
      fVar15 = 1.0 / fVar15;
      fVar14 = -fVar8 * fVar15;
      fVar12 = fVar11 * fVar15;
      fVar16 = fVar16 * fVar15;
      fVar8 = -fVar9 * fVar12;
      fVar9 = fVar9 * fVar14;
    }
    pbVar5 = (this->super_btTypedConstraint).m_rbA;
    fVar11 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    fVar15 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    fVar10 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    fVar1 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    fVar2 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    fVar3 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_148.m_el[2].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    jointAxis0.m_floats[1] = fVar12 * fVar1 + fVar13 * fVar10 + fVar11 * fVar14;
    jointAxis0.m_floats[0] =
         fVar12 * fVar15 +
         fVar13 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar14;
    jointAxis0.m_floats[2] =
         fVar12 * local_148.m_el[2].m_floats[2] + fVar13 * fVar2 + fVar14 * fVar3;
    jointAxis0.m_floats[3] = 0.0;
    jointAxis1.m_floats[1] = fVar9 * fVar1 + fVar16 * fVar10 + fVar11 * fVar8;
    jointAxis1.m_floats[0] =
         fVar9 * fVar15 +
         fVar16 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar8;
    jointAxis1.m_floats[2] = fVar8 * fVar3 + fVar2 * fVar16 + local_148.m_el[2].m_floats[2] * fVar9;
    jointAxis1.m_floats[3] = 0.0;
    fVar9 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar8 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar16 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    hingeAxisWorld.m_floats[1] = fVar16 * fVar1 + fVar9 * fVar10 + fVar8 * fVar11;
    hingeAxisWorld.m_floats[0] =
         fVar16 * fVar15 +
         fVar9 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
         fVar8 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    hingeAxisWorld.m_floats[2] =
         fVar2 * fVar9 + fVar3 * fVar8 + local_148.m_el[2].m_floats[2] * fVar16;
    hingeAxisWorld.m_floats[3] = 0.0;
    local_148.m_el[0].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_148.m_el[0].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_148.m_el[0].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_148.m_el[0].m_floats[3] = 0.0;
    local_148.m_el[1].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_148.m_el[1].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_148.m_el[1].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_148.m_el[1].m_floats[3] = 0.0;
    local_148.m_el[2].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_148.m_el[2].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_148.m_el[2].m_floats[3] = 0.0;
    pbVar6 = (this->super_btTypedConstraint).m_rbB;
    local_c8.m_el[0].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_c8.m_el[0].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_c8.m_el[0].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_c8.m_el[0].m_floats[3] = 0.0;
    local_c8.m_el[1].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_c8.m_el[1].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_c8.m_el[1].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_c8.m_el[1].m_floats[3] = 0.0;
    local_c8.m_el[2].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_c8.m_el[2].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_c8.m_el[2].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_c8.m_el[2].m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng,&jointAxis0,&local_148,&local_c8,&pbVar5->m_invInertiaLocal,
               &pbVar6->m_invInertiaLocal);
    pbVar5 = (this->super_btTypedConstraint).m_rbA;
    local_148.m_el[0].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_148.m_el[0].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_148.m_el[0].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_148.m_el[0].m_floats[3] = 0.0;
    local_148.m_el[1].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_148.m_el[1].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_148.m_el[1].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_148.m_el[1].m_floats[3] = 0.0;
    local_148.m_el[2].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_148.m_el[2].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_148.m_el[2].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_148.m_el[2].m_floats[3] = 0.0;
    pbVar6 = (this->super_btTypedConstraint).m_rbB;
    local_c8.m_el[0].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_c8.m_el[0].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_c8.m_el[0].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_c8.m_el[0].m_floats[3] = 0.0;
    local_c8.m_el[1].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_c8.m_el[1].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_c8.m_el[1].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_c8.m_el[1].m_floats[3] = 0.0;
    local_c8.m_el[2].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_c8.m_el[2].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_c8.m_el[2].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_c8.m_el[2].m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng + 1,&jointAxis1,&local_148,&local_c8,&pbVar5->m_invInertiaLocal,
               &pbVar6->m_invInertiaLocal);
    pbVar5 = (this->super_btTypedConstraint).m_rbA;
    local_148.m_el[0].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_148.m_el[0].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_148.m_el[0].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_148.m_el[0].m_floats[3] = 0.0;
    local_148.m_el[1].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_148.m_el[1].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_148.m_el[1].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_148.m_el[1].m_floats[3] = 0.0;
    local_148.m_el[2].m_floats[1] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_148.m_el[2].m_floats[0] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_148.m_el[2].m_floats[2] =
         (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_148.m_el[2].m_floats[3] = 0.0;
    pbVar6 = (this->super_btTypedConstraint).m_rbB;
    local_c8.m_el[0].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_c8.m_el[0].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_c8.m_el[0].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_c8.m_el[0].m_floats[3] = 0.0;
    local_c8.m_el[1].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_c8.m_el[1].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_c8.m_el[1].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_c8.m_el[1].m_floats[3] = 0.0;
    local_c8.m_el[2].m_floats[0] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_c8.m_el[2].m_floats[1] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_c8.m_el[2].m_floats[2] =
         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_c8.m_el[2].m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng + 2,&hingeAxisWorld,&local_148,&local_c8,&pbVar5->m_invInertiaLocal,
               &pbVar6->m_invInertiaLocal);
    this->m_accLimitImpulse = 0.0;
    angle = getHingeAngle(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                                m_worldTransform,
                          &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                           m_worldTransform);
    this->m_hingeAngle = angle;
    btAngularLimit::test(&this->m_limit,angle);
    fVar9 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar11 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar8 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    pbVar5 = (this->super_btTypedConstraint).m_rbA;
    pbVar6 = (this->super_btTypedConstraint).m_rbB;
    fVar15 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar8
             + (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] *
               fVar9 + (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [1] * fVar11;
    fVar10 = (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar8
             + (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] *
               fVar9 + (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [1] * fVar11;
    fVar9 = fVar8 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] +
            fVar9 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] +
            fVar11 * (pbVar5->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    this->m_kHinge =
         1.0 / ((*(float *)&pbVar6->field_0x174 * fVar9 +
                *(float *)&pbVar6->field_0x154 * fVar15 + *(float *)&pbVar6->field_0x164 * fVar10) *
                fVar9 + (*(float *)&pbVar6->field_0x16c * fVar9 +
                        *(float *)&(pbVar6->super_btCollisionObject).field_0x14c * fVar15 +
                        *(float *)&pbVar6->field_0x15c * fVar10) * fVar15 +
                        (*(float *)&pbVar6->field_0x170 * fVar9 +
                        *(float *)&pbVar6->field_0x150 * fVar15 +
                        *(float *)&pbVar6->field_0x160 * fVar10) * fVar10 +
               (*(float *)&pbVar5->field_0x174 * fVar9 +
               *(float *)&pbVar5->field_0x154 * fVar15 + *(float *)&pbVar5->field_0x164 * fVar10) *
               fVar9 + (*(float *)&pbVar5->field_0x16c * fVar9 +
                       *(float *)&(pbVar5->super_btCollisionObject).field_0x14c * fVar15 +
                       *(float *)&pbVar5->field_0x15c * fVar10) * fVar15 +
                       (*(float *)&pbVar5->field_0x170 * fVar9 +
                       *(float *)&pbVar5->field_0x150 * fVar15 +
                       *(float *)&pbVar5->field_0x160 * fVar10) * fVar10);
  }
  return;
}

Assistant:

void	btHingeConstraint::buildJacobian()
{
	if (m_useSolveConstraintObsolete)
	{
		m_appliedImpulse = btScalar(0.);
		m_accMotorImpulse = btScalar(0.);

		if (!m_angularOnly)
		{
			btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
			btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();
			btVector3 relPos = pivotBInW - pivotAInW;

			btVector3 normal[3];
			if (relPos.length2() > SIMD_EPSILON)
			{
				normal[0] = relPos.normalized();
			}
			else
			{
				normal[0].setValue(btScalar(1.0),0,0);
			}

			btPlaneSpace1(normal[0], normal[1], normal[2]);

			for (int i=0;i<3;i++)
			{
				new (&m_jac[i]) btJacobianEntry(
				m_rbA.getCenterOfMassTransform().getBasis().transpose(),
				m_rbB.getCenterOfMassTransform().getBasis().transpose(),
				pivotAInW - m_rbA.getCenterOfMassPosition(),
				pivotBInW - m_rbB.getCenterOfMassPosition(),
				normal[i],
				m_rbA.getInvInertiaDiagLocal(),
				m_rbA.getInvMass(),
				m_rbB.getInvInertiaDiagLocal(),
				m_rbB.getInvMass());
			}
		}

		//calculate two perpendicular jointAxis, orthogonal to hingeAxis
		//these two jointAxis require equal angular velocities for both bodies

		//this is unused for now, it's a todo
		btVector3 jointAxis0local;
		btVector3 jointAxis1local;
		
		btPlaneSpace1(m_rbAFrame.getBasis().getColumn(2),jointAxis0local,jointAxis1local);

		btVector3 jointAxis0 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis0local;
		btVector3 jointAxis1 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis1local;
		btVector3 hingeAxisWorld = getRigidBodyA().getCenterOfMassTransform().getBasis() * m_rbAFrame.getBasis().getColumn(2);
			
		new (&m_jacAng[0])	btJacobianEntry(jointAxis0,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[1])	btJacobianEntry(jointAxis1,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[2])	btJacobianEntry(hingeAxisWorld,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

			// clear accumulator
			m_accLimitImpulse = btScalar(0.);

			// test angular limit
			testLimit(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());

		//Compute K = J*W*J' for hinge axis
		btVector3 axisA =  getRigidBodyA().getCenterOfMassTransform().getBasis() *  m_rbAFrame.getBasis().getColumn(2);
		m_kHinge =   1.0f / (getRigidBodyA().computeAngularImpulseDenominator(axisA) +
							 getRigidBodyB().computeAngularImpulseDenominator(axisA));

	}
}